

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O1

int32_t tnt_schema_stosid(tnt_schema *schema_obj,char *name,uint32_t name_len)

{
  uint uVar1;
  mh_assoc_t *pmVar2;
  mh_int_t *pmVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  int32_t iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  pmVar2 = schema_obj->space_hash;
  uVar4 = PMurHash32(0xd,name,name_len);
  uVar1 = pmVar2->n_buckets;
  uVar10 = (ulong)uVar4 % (ulong)uVar1;
  pmVar3 = pmVar2->b;
  while( true ) {
    uVar8 = (uint)uVar10;
    uVar6 = pmVar3[uVar10 >> 4];
    if (((((uVar6 >> (uVar8 & 0xf) & 1) != 0) && ((pmVar2->p[uVar10]->key).id_len == name_len)) &&
        (iVar5 = bcmp(name,(pmVar2->p[uVar10]->key).id,(ulong)name_len), uVar9 = uVar8, iVar5 == 0))
       || (uVar9 = uVar1, ((uVar6 >> (sbyte)(uVar8 & 0xf)) >> 0x10 & 1) == 0)) break;
    uVar8 = uVar8 + uVar4 % (uVar1 - 1) + 1;
    uVar6 = uVar1;
    if (uVar8 < uVar1) {
      uVar6 = 0;
    }
    uVar10 = (ulong)(uVar8 - uVar6);
  }
  iVar7 = -1;
  if (uVar9 != uVar1) {
    iVar7 = *(int32_t *)((long)pmVar2->p[uVar9]->data + 0xc);
  }
  return iVar7;
}

Assistant:

int32_t tnt_schema_stosid(struct tnt_schema *schema_obj, const char *name,
			  uint32_t name_len) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	struct assoc_key space_key = {name, name_len};
	mh_int_t space_slot = mh_assoc_find(schema, &space_key, NULL);
	if (space_slot == mh_end(schema))
		return -1;
	const struct tnt_schema_sval *space =
		(*mh_assoc_node(schema, space_slot))->data;
	return space->number;
}